

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

bool nivalis::util::is_varname(string_view expr)

{
  bool bVar1;
  const_reference pvVar2;
  size_type sVar3;
  size_t k;
  ulong local_20;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  bool local_1;
  
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_18,0);
  bVar1 = is_varname_first(*pvVar2);
  if (bVar1) {
    for (local_20 = 1;
        sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18),
        local_20 < sVar3; local_20 = local_20 + 1) {
      std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_18,local_20);
      bVar1 = is_identifier('\0');
      if (!bVar1) {
        return false;
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool is_varname(std::string_view expr) {
    if(!util::is_varname_first(expr[0])) return false;
    for (size_t k = 1; k < expr.size(); ++k) {
        if (!util::is_identifier(expr[k])) return false;
    }
    return true;
}